

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall QXmlStreamWriterPrivate::indent(QXmlStreamWriterPrivate *this,int level)

{
  size_t in_RCX;
  
  if ((this->field_0x79 & 3) != 0) {
    write(this,0x4e3fd8,(void *)0x1,in_RCX);
  }
  if (0 < level) {
    do {
      write(this,(int)(this->autoFormattingIndent)._M_dataplus._M_p,
            (void *)(this->autoFormattingIndent)._M_string_length,in_RCX);
      level = level + -1;
    } while (level != 0);
  }
  return;
}

Assistant:

void QXmlStreamWriterPrivate::indent(int level)
{
    if (didWriteStartDocument || didWriteAnyToken)
        write("\n");
    for (int i = 0; i < level; ++i)
        write(autoFormattingIndent);
}